

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O0

err_t cvrFind(int argc,char **argv)

{
  blob_t pvVar1;
  size_t *count;
  int in_EDI;
  octet *certs;
  size_t ring_len;
  cmd_sig_t *sig;
  size_t sig_len;
  octet *cert;
  size_t cert_len;
  void *stack;
  err_t code;
  size_t in_stack_ffffffffffffff98;
  char **in_stack_ffffffffffffffa8;
  char *name;
  size_t *in_stack_ffffffffffffffb0;
  cmd_sig_t *in_stack_ffffffffffffffb8;
  size_t *certs_00;
  size_t *in_stack_ffffffffffffffc8;
  char *local_28;
  err_t local_4;
  
  if (in_EDI == 2) {
    local_4 = cmdFileValExist((int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (((local_4 == 0) &&
        (local_4 = cmdFileReadAll(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  (char *)in_stack_ffffffffffffffa8), local_4 == 0)) &&
       (local_4 = cmdFileReadAll(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                 (char *)in_stack_ffffffffffffffa8), local_4 == 0)) {
      name = local_28;
      pvVar1 = blobCreate(in_stack_ffffffffffffff98);
      local_4 = 0x6e;
      if (pvVar1 != (blob_t)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        count = (size_t *)((long)pvVar1 + (long)local_28);
        certs_00 = count;
        local_4 = cmdFileReadAll(in_stack_ffffffffffffffb8,count,name);
        if (local_4 == 0) {
          local_4 = cmdSigRead(in_stack_ffffffffffffffb8,count,name);
          if (local_4 == 0) {
            local_4 = cmdFileReadAll(in_stack_ffffffffffffffb8,count,name);
            if (local_4 == 0) {
              local_4 = cmdCVCsFind(in_stack_ffffffffffffffc8,(octet *)certs_00,
                                    (size_t)in_stack_ffffffffffffffb8,(octet *)count,(size_t)name);
              blobClose((blob_t)0x111d5a);
            }
            else {
              blobClose((blob_t)0x111d20);
            }
          }
          else {
            blobClose((blob_t)0x111cea);
          }
        }
        else {
          blobClose((blob_t)0x111cb1);
        }
      }
    }
  }
  else {
    local_4 = 0x25b;
  }
  return local_4;
}

Assistant:

static err_t cvrFind(int argc, char* argv[])
{
	err_t code;
	void* stack;
	size_t cert_len;
	octet* cert;
	size_t sig_len;
	cmd_sig_t* sig;
	size_t ring_len;
	octet* certs;
	// обработать опции
	if (argc != 2)
		return ERR_CMD_PARAMS;
	// проверить наличие файлов
	code = cmdFileValExist(2, argv);
	ERR_CALL_CHECK(code);
	// определить длину cert
	code = cmdFileReadAll(0, &cert_len, argv[1]);
	ERR_CALL_CHECK(code);
	// определить длину кольца
	code = cmdFileReadAll(0, &ring_len, argv[0]);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, cert_len + MAX2(sizeof(cmd_sig_t), ring_len));
	ERR_CALL_CHECK(code);
	cert = (octet*)stack;
	certs = cert + cert_len;
	sig = (cmd_sig_t*)certs;
	// прочитать cert
	code = cmdFileReadAll(cert, &cert_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить длину подписи
	code = cmdSigRead(sig, &sig_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// прочитать кольцо
	code = cmdFileReadAll(certs, &ring_len, argv[0]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// найти сертификат
	code = cmdCVCsFind(0, certs, ring_len - sig_len, cert, cert_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}